

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_types(Parser *this)

{
  State *pSVar1;
  Tree *this_00;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  long lVar11;
  bool bVar12;
  undefined1 uVar13;
  bool bVar14;
  YamlTag_e YVar15;
  int iVar16;
  char *pcVar17;
  size_t sVar18;
  size_t sVar19;
  pfn_error p_Var20;
  uint uVar21;
  ulong uVar22;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  void *pvVar23;
  ulong extraout_RDX_01;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  ro_substr chars_01;
  csubstr tag;
  ro_substr chars_02;
  csubstr cVar27;
  csubstr anchor;
  char msg [27];
  basic_substring<const_char> local_228;
  basic_substring<const_char> local_218;
  basic_substring<const_char> local_208;
  undefined3 uStack_1f8;
  undefined3 uStack_1f5;
  undefined2 uStack_1f2;
  undefined3 uStack_1f0;
  undefined3 uStack_1ed;
  undefined2 uStack_1ea;
  undefined8 local_1e8;
  undefined3 uStack_1e0;
  undefined2 uStack_1dd;
  undefined3 uStack_1db;
  undefined3 uStack_1d8;
  undefined2 uStack_1d5;
  undefined6 uStack_1d3;
  undefined2 uStack_1cd;
  size_t local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_228 = basic_substring<const_char>::triml(&(this->m_state->line_contents).rem,' ');
  uVar22 = local_228.len;
  pcVar17 = local_228.str;
  local_218.str = (char *)0x0;
  local_218.len = 0;
  if (uVar22 < 2) goto LAB_001d619d;
  if (*pcVar17 == '!') {
    lVar11 = 0;
    do {
      lVar24 = lVar11;
      if (lVar24 == 1) break;
      lVar11 = lVar24 + 1;
    } while (pcVar17[lVar24 + 1] == "!!"[lVar24 + 1]);
    if (lVar24 == 0) goto LAB_001d6122;
    chars.len = 2;
    chars.str = " ,";
    sVar18 = basic_substring<const_char>::first_of(&local_228,chars,0);
    if ((sVar18 != 0xffffffffffffffff) && (local_228.len < sVar18)) {
      if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar18 == 0xffffffffffffffff) {
      local_208.str = local_228.str;
      local_208.len._0_3_ = (undefined3)local_228.len;
      local_208.len._3_3_ = local_228.len._3_3_;
      local_208.len._6_2_ = local_228.len._6_2_;
    }
    else {
      basic_substring<const_char>::basic_substring(&local_208,local_228.str,sVar18);
    }
    local_218.len =
         CONCAT26(local_208.len._6_2_,CONCAT33(local_208.len._3_3_,(undefined3)local_208.len));
    local_218.str = local_208.str;
    if (local_218.len < (char *)0x2) {
      uStack_1f8 = 0x656c2e;
      uStack_1f5 = 0x3e206e;
      uStack_1f2 = 0x203d;
      uStack_1f0 = 0x2932;
      local_208.str = (char *)0x6166206b63656863;
      local_208.len._0_3_ = 0x656c69;
      local_208.len._3_3_ = 0x203a64;
      local_208.len._6_2_ = 0x7428;
      if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      local_80 = 0;
      uStack_78 = 0x722a;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x722a) << 0x40);
      LVar3.name.str._0_4_ = 0x1fbeda;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = 0;
      LVar3.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_208,0x1b,LVar3,(this->m_stack).m_callbacks.m_user_data);
    }
    iVar16 = basic_substring<const_char>::compare(&local_218,"!!set",5);
    if (iVar16 == 0) {
      this->m_state->flags = this->m_state->flags | 0x800;
    }
  }
  else {
LAB_001d6122:
    if ((uVar22 < 2) || (*pcVar17 != '!')) {
LAB_001d619d:
      if ((2 < uVar22) && (*pcVar17 == '!')) {
        uVar26 = 0;
        do {
          uVar25 = uVar26;
          if (uVar25 == 2) break;
          uVar26 = uVar25 + 1;
        } while (pcVar17[uVar25 + 1] == "!h!"[uVar25 + 1]);
        if (1 < uVar25) {
          sVar18 = basic_substring<const_char>::first_of(&local_228,' ',0);
          if ((sVar18 != 0xffffffffffffffff) && (local_228.len < sVar18)) {
            if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
              pcVar2 = (code *)swi(3);
              uVar13 = (*pcVar2)();
              return (bool)uVar13;
            }
            handle_error(0x1fbf87,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar18 == 0xffffffffffffffff) {
            local_208.str = local_228.str;
            local_208.len._0_3_ = (undefined3)local_228.len;
            local_208.len._3_3_ = local_228.len._3_3_;
            local_208.len._6_2_ = local_228.len._6_2_;
          }
          else {
            basic_substring<const_char>::basic_substring(&local_208,local_228.str,sVar18);
          }
          local_218.len =
               CONCAT26(local_208.len._6_2_,CONCAT33(local_208.len._3_3_,(undefined3)local_208.len))
          ;
          local_218.str = local_208.str;
          if ((char *)0x2 < local_218.len) goto LAB_001d65a6;
          uStack_1f8 = 0x656c2e;
          uStack_1f5 = 0x3e206e;
          uStack_1f2 = 0x203d;
          uStack_1f0 = 0x2933;
          local_208.str = (char *)0x6166206b63656863;
          local_208.len._0_3_ = 0x656c69;
          local_208.len._3_3_ = 0x203a64;
          local_208.len._6_2_ = 0x7428;
          if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            uVar13 = (*pcVar2)();
            return (bool)uVar13;
          }
          p_Var20 = (this->m_stack).m_callbacks.m_error;
          local_d0 = 0;
          uStack_c8 = 0x723a;
          local_c0 = 0;
          pcStack_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b0 = 0x65;
          pvVar23 = (this->m_stack).m_callbacks.m_user_data;
          uStack_c8._0_4_ = 0x723a;
          uVar21 = (uint)uStack_c8;
          goto LAB_001d6591;
        }
      }
      if ((uVar22 != 0) && (*pcVar17 == '!')) {
        sVar18 = basic_substring<const_char>::first_of(&local_228,' ',0);
        if ((sVar18 != 0xffffffffffffffff) && (local_228.len < sVar18)) {
          if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            uVar13 = (*pcVar2)();
            return (bool)uVar13;
          }
          handle_error(0x1fbf87,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar18 == 0xffffffffffffffff) {
          local_208.str = local_228.str;
          local_208.len._0_3_ = (undefined3)local_228.len;
          local_208.len._3_3_ = local_228.len._3_3_;
          local_208.len._6_2_ = local_228.len._6_2_;
        }
        else {
          basic_substring<const_char>::basic_substring(&local_208,local_228.str,sVar18);
        }
        local_218.len =
             CONCAT26(local_208.len._6_2_,CONCAT33(local_208.len._3_3_,(undefined3)local_208.len));
        local_218.str = local_208.str;
        if ((char *)local_218.len == (char *)0x0) {
          uStack_1f8 = 0x656c2e;
          uStack_1f5 = 0x3e206e;
          uStack_1f2 = 0x203d;
          uStack_1f0 = 0x2931;
          local_208.str = (char *)0x6166206b63656863;
          local_208.len._0_3_ = 0x656c69;
          local_208.len._3_3_ = 0x203a64;
          local_208.len._6_2_ = 0x7428;
          if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            uVar13 = (*pcVar2)();
            return (bool)uVar13;
          }
          p_Var20 = (this->m_stack).m_callbacks.m_error;
          local_f8 = 0;
          uStack_f0 = 0x7241;
          local_e8 = 0;
          pcStack_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x65;
          pvVar23 = (this->m_stack).m_callbacks.m_user_data;
          uVar21 = 0x7241;
          goto LAB_001d6591;
        }
      }
    }
    else {
      lVar11 = 0;
      do {
        lVar24 = lVar11;
        if (lVar24 == 1) break;
        lVar11 = lVar24 + 1;
      } while (pcVar17[lVar24 + 1] == "!<"[lVar24 + 1]);
      if (lVar24 == 0) goto LAB_001d619d;
      sVar18 = basic_substring<const_char>::first_of(&local_228,'>',0);
      if ((sVar18 != 0xffffffffffffffff) && (local_228.len < sVar18)) {
        if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          uVar13 = (*pcVar2)();
          return (bool)uVar13;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1572,"pos <= len || pos == npos");
      }
      if (sVar18 == 0xffffffffffffffff) {
        local_208.str = local_228.str;
        local_208.len._0_3_ = (undefined3)local_228.len;
        local_208.len._3_3_ = local_228.len._3_3_;
        local_208.len._6_2_ = local_228.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring(&local_208,local_228.str,sVar18 + 1);
      }
      local_218.len =
           CONCAT26(local_208.len._6_2_,CONCAT33(local_208.len._3_3_,(undefined3)local_208.len));
      local_218.str = local_208.str;
      if ((char *)0x1 < local_218.len) goto LAB_001d65a6;
      uStack_1f8 = 0x656c2e;
      uStack_1f5 = 0x3e206e;
      uStack_1f2 = 0x203d;
      uStack_1f0 = 0x2932;
      local_208.str = (char *)0x6166206b63656863;
      local_208.len._0_3_ = 0x656c69;
      local_208.len._3_3_ = 0x203a64;
      local_208.len._6_2_ = 0x7428;
      if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      p_Var20 = (this->m_stack).m_callbacks.m_error;
      local_a8 = 0;
      uStack_a0 = 0x7233;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      pvVar23 = (this->m_stack).m_callbacks.m_user_data;
      uStack_a0._0_4_ = 0x7233;
      uVar21 = (uint)uStack_a0;
LAB_001d6591:
      auVar4 = ZEXT424(uVar21) << 0x40;
      LVar5.name.str._0_4_ = 0x1fbeda;
      LVar5.super_LineCol.offset = auVar4._0_8_;
      LVar5.super_LineCol.line = auVar4._8_8_;
      LVar5.super_LineCol.col = auVar4._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*p_Var20)((char *)&local_208,0x1b,LVar5,pvVar23);
    }
  }
LAB_001d65a6:
  bVar12 = (yml *)local_218.str != (yml *)0x0 && (char *)local_218.len != (char *)0x0;
  if ((yml *)local_218.str == (yml *)0x0 || (char *)local_218.len == (char *)0x0) {
    return bVar12;
  }
  uVar21 = this->m_state->flags;
  if ((~uVar21 & 0x220) == 0) {
    if ((uVar21 & 0x40) == 0) {
      uStack_1f8 = 0x5f7361;
      uStack_1f5 = 0x796e61;
      uStack_1f2 = 0x5228;
      uStack_1f0 = 0x59454b;
      uStack_1ed = 0x2929;
      local_208.str = (char *)0x6166206b63656863;
      local_208.len._0_3_ = 0x656c69;
      local_208.len._3_3_ = 0x203a64;
      local_208.len._6_2_ = 0x6828;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      local_120 = 0;
      uStack_118 = 0x724a;
      local_110 = 0;
      pcStack_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x724a) << 0x40);
      LVar6.name.str._0_4_ = 0x1fbeda;
      LVar6.super_LineCol.offset = auVar4._0_8_;
      LVar6.super_LineCol.line = auVar4._8_8_;
      LVar6.super_LineCol.col = auVar4._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_208,0x1e,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar17 = (this->m_buf).str;
    if ((local_228.str + -1 < pcVar17) || (pcVar17 + (this->m_buf).len < local_228.str + -1)) {
      uStack_1d8 = 0x667562;
      uStack_1d5 = 0x652e;
      uStack_1d3 = 0x292928646e;
      local_1e8._0_1_ = 'n';
      local_1e8._1_1_ = '(';
      local_1e8._2_1_ = ')';
      local_1e8._3_1_ = ' ';
      local_1e8._4_1_ = '&';
      local_1e8._5_1_ = '&';
      local_1e8._6_1_ = ' ';
      local_1e8._7_1_ = 's';
      uStack_1e0 = 0x207274;
      uStack_1dd = 0x3d3c;
      uStack_1db = 0x5f6d20;
      uStack_1f8 = 0x207274;
      uStack_1f5 = 0x203d3e;
      uStack_1f2 = 0x5f6d;
      uStack_1f0 = 0x667562;
      uStack_1ed = 0x65622e;
      uStack_1ea = 0x6967;
      local_208.str = (char *)0x6166206b63656863;
      local_208.len._0_3_ = 0x656c69;
      local_208.len._3_3_ = 0x203a64;
      local_208.len._6_2_ = 0x7328;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      local_58 = 0;
      uStack_50 = 0x5e96;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x5e96) << 0x40);
      LVar7.name.str._0_4_ = 0x1fbeda;
      LVar7.super_LineCol.offset = auVar4._0_8_;
      LVar7.super_LineCol.line = auVar4._8_8_;
      LVar7.super_LineCol.col = auVar4._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_208,0x3b,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val(this,(csubstr)ZEXT816(0),0);
    this->m_state->flags = this->m_state->flags & 0xffffffdf;
  }
  cVar27.len = local_218.len;
  cVar27.str = local_218.str;
  sVar18 = LineContents::current_col(&this->m_state->line_contents,cVar27);
  if ((yml *)(local_218.str + local_218.len) <= (yml *)(this->m_state->line_contents).rem.str) {
    uStack_1d8 = 0x6d6572;
    uStack_1d5 = 0x622e;
    uStack_1d3 = 0x29286e696765;
    uStack_1cd = 0x29;
    local_1e8._0_1_ = '-';
    local_1e8._1_1_ = '>';
    local_1e8._2_1_ = 'l';
    local_1e8._3_1_ = 'i';
    local_1e8._4_1_ = 'n';
    local_1e8._5_1_ = 'e';
    local_1e8._6_1_ = '_';
    local_1e8._7_1_ = 'c';
    uStack_1e0 = 0x746e6f;
    uStack_1dd = 0x6e65;
    uStack_1db = 0x2e7374;
    uStack_1f8 = 0x6e652e;
    uStack_1f5 = 0x292864;
    uStack_1f2 = 0x3e20;
    uStack_1f0 = 0x5f6d20;
    uStack_1ed = 0x617473;
    uStack_1ea = 0x6574;
    local_208.str = (char *)0x6166206b63656863;
    local_208.len._0_3_ = 0x656c69;
    local_208.len._3_3_ = 0x203a64;
    local_208.len._6_2_ = 0x7428;
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      uVar13 = (*pcVar2)();
      return (bool)uVar13;
    }
    local_148 = 0;
    uStack_140 = 0x7255;
    local_138 = 0;
    pcStack_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_128 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x7255) << 0x40);
    LVar8.name.str._0_4_ = 0x1fbeda;
    LVar8.super_LineCol.offset = auVar4._0_8_;
    LVar8.super_LineCol.line = auVar4._8_8_;
    LVar8.super_LineCol.col = auVar4._16_8_;
    LVar8.name.str._4_4_ = 0;
    LVar8.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_208,0x3d,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  _line_progressed(this,(long)(local_218.str + local_218.len) -
                        (long)(this->m_state->line_contents).rem.str);
  chars_00.len = 2;
  chars_00.str = " \t";
  sVar19 = basic_substring<const_char>::first_not_of(&(this->m_state->line_contents).rem,chars_00,0)
  ;
  if (sVar19 != 0xffffffffffffffff) {
    _line_progressed(this,sVar19);
  }
  pSVar1 = this->m_state;
  uVar21 = ~pSVar1->flags;
  uVar22 = (ulong)uVar21;
  if ((uVar21 & 0x44) == 0) {
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      uStack_1f8 = 0x656b5f;
      uStack_1f5 = 0x745f79;
      uStack_1f2 = 0x6761;
      uStack_1f0 = 0x6d652e;
      uStack_1ed = 0x797470;
      uStack_1ea = 0x2928;
      local_208.str = (char *)0x6166206b63656863;
      local_208.len._0_3_ = 0x656c69;
      local_208.len._3_3_ = 0x203a64;
      local_208.len._6_2_ = 0x6d28;
      local_1e8._0_2_ = 0x29;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        uVar13 = (*pcVar2)();
        return (bool)uVar13;
      }
      local_170 = 0;
      uStack_168 = 0x7260;
      local_160 = 0;
      pcStack_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_150 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x7260) << 0x40);
      LVar9.name.str._0_4_ = 0x1fbeda;
      LVar9.super_LineCol.offset = auVar4._0_8_;
      LVar9.super_LineCol.line = auVar4._8_8_;
      LVar9.super_LineCol.col = auVar4._16_8_;
      LVar9.name.str._4_4_ = 0;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_208,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
      uVar22 = extraout_RDX;
    }
    (this->m_key_tag).str = local_218.str;
    (this->m_key_tag).len = local_218.len;
  }
  else {
    if ((uVar21 & 0x84) == 0) {
      local_228.str = (pSVar1->line_contents).rem.str;
      sVar19 = (pSVar1->line_contents).rem.len;
      uVar22 = 0xffffffffffffffff;
      local_228.len = sVar19;
      if (sVar19 != 0) {
        uVar26 = 0;
        local_1c8 = sVar18;
        do {
          if (local_228.len <= uVar26) {
            _handle_types();
          }
          sVar18 = local_1c8;
          uVar22 = uVar26;
        } while ((*(yml *)(local_228.str + uVar26) != (yml)0x23) &&
                (uVar26 = uVar26 + 1, uVar22 = 0xffffffffffffffff, sVar19 != uVar26));
      }
      if ((uVar22 != 0xffffffffffffffff) && (local_228.len < uVar22)) {
        if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          uVar13 = (*pcVar2)();
          return (bool)uVar13;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (uVar22 == 0xffffffffffffffff) {
        local_208.str = local_228.str;
        local_208.len._0_3_ = (undefined3)local_228.len;
        local_208.len._3_3_ = (undefined3)(local_228.len >> 0x18);
        local_208.len._6_2_ = (undefined2)(local_228.len >> 0x30);
      }
      else {
        basic_substring<const_char>::basic_substring(&local_208,local_228.str,uVar22);
      }
      local_228.len._3_3_ = local_208.len._3_3_;
      local_228.len._0_3_ = (undefined3)local_208.len;
      local_228.len._6_2_ = local_208.len._6_2_;
      local_228.str = local_208.str;
      chars_01.len = 2;
      chars_01.str = " \t";
      local_228 = basic_substring<const_char>::trimr(&local_228,chars_01);
      uVar22 = local_228.len;
      if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
        uStack_1f8 = 0x61765f;
        uStack_1f5 = 0x745f6c;
        uStack_1f2 = 0x6761;
        uStack_1f0 = 0x6d652e;
        uStack_1ed = 0x797470;
        uStack_1ea = 0x2928;
        local_208.str = (char *)0x6166206b63656863;
        local_208.len._0_3_ = 0x656c69;
        local_208.len._3_3_ = 0x203a64;
        local_208.len._6_2_ = 0x6d28;
        local_1e8._0_2_ = 0x29;
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          uVar13 = (*pcVar2)();
          return (bool)uVar13;
        }
        p_Var20 = (this->m_stack).m_callbacks.m_error;
        local_198 = 0;
        uStack_190 = 0x7279;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        pvVar23 = (this->m_stack).m_callbacks.m_user_data;
        uStack_190._0_4_ = 0x7279;
        uVar21 = (uint)uStack_190;
LAB_001d6bac:
        auVar4 = ZEXT424(uVar21) << 0x40;
        LVar10.name.str._0_4_ = 0x1fbeda;
        LVar10.super_LineCol.offset = auVar4._0_8_;
        LVar10.super_LineCol.line = auVar4._8_8_;
        LVar10.super_LineCol.col = auVar4._16_8_;
        LVar10.name.str._4_4_ = 0;
        LVar10.name.len = 0x65;
        (*p_Var20)((char *)&local_208,0x22,LVar10,pvVar23);
        uVar22 = extraout_RDX_01;
      }
LAB_001d6bc1:
      (this->m_val_tag).str = local_218.str;
      (this->m_val_tag).len = local_218.len;
LAB_001d6bca:
      this->m_val_tag_indentation = sVar18;
      goto LAB_001d6bd1;
    }
    bVar14 = (uVar21 & 0x1003) != 0;
    uVar22 = (ulong)CONCAT31((int3)(uVar21 >> 8),bVar14);
    if ((uVar21 & 0x88) != 0 && bVar14) {
      if ((pSVar1->flags & 2U) == 0) {
        bVar14 = is_debugger_attached();
        if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          uVar13 = (*pcVar2)();
          return (bool)uVar13;
        }
        fmt.len = 0x15;
        fmt.str = "ERROR: internal error";
        _err<>(this,fmt);
        uVar22 = extraout_RDX_00;
        goto LAB_001d6bd1;
      }
      local_228.str = (pSVar1->line_contents).rem.str;
      sVar19 = (pSVar1->line_contents).rem.len;
      uVar22 = 0xffffffffffffffff;
      local_228.len = sVar19;
      if (sVar19 != 0) {
        uVar26 = 0;
        local_1c8 = sVar18;
        do {
          if (local_228.len <= uVar26) {
            _handle_types();
          }
          sVar18 = local_1c8;
          uVar22 = uVar26;
        } while ((*(yml *)(local_228.str + uVar26) != (yml)0x23) &&
                (uVar26 = uVar26 + 1, uVar22 = 0xffffffffffffffff, sVar19 != uVar26));
      }
      if ((uVar22 != 0xffffffffffffffff) && (local_228.len < uVar22)) {
        if (((s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          uVar13 = (*pcVar2)();
          return (bool)uVar13;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (uVar22 == 0xffffffffffffffff) {
        local_208.str = local_228.str;
        local_208.len._0_3_ = (undefined3)local_228.len;
        local_208.len._3_3_ = (undefined3)(local_228.len >> 0x18);
        local_208.len._6_2_ = (undefined2)(local_228.len >> 0x30);
      }
      else {
        basic_substring<const_char>::basic_substring(&local_208,local_228.str,uVar22);
      }
      local_228.len._3_3_ = local_208.len._3_3_;
      local_228.len._0_3_ = (undefined3)local_208.len;
      local_228.len._6_2_ = local_208.len._6_2_;
      local_228.str = local_208.str;
      chars_02.len = 2;
      chars_02.str = " \t";
      local_228 = basic_substring<const_char>::trimr(&local_228,chars_02);
      uVar22 = local_228.len;
      if (local_228.str == (char *)0x0 || uVar22 == 0) {
        if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
          uStack_1f8 = 0x61765f;
          uStack_1f5 = 0x745f6c;
          uStack_1f2 = 0x6761;
          uStack_1f0 = 0x6d652e;
          uStack_1ed = 0x797470;
          uStack_1ea = 0x2928;
          local_208.str = (char *)0x6166206b63656863;
          local_208.len._0_3_ = 0x656c69;
          local_208.len._3_3_ = 0x203a64;
          local_208.len._6_2_ = 0x6d28;
          local_1e8._0_2_ = 0x29;
          if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            uVar13 = (*pcVar2)();
            return (bool)uVar13;
          }
          p_Var20 = (this->m_stack).m_callbacks.m_error;
          local_1c0 = 0;
          uStack_1b8 = 0x7294;
          local_1b0 = 0;
          pcStack_1a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1a0 = 0x65;
          pvVar23 = (this->m_stack).m_callbacks.m_user_data;
          uStack_1b8._0_4_ = 0x7294;
          uVar21 = (uint)uStack_1b8;
          goto LAB_001d6bac;
        }
        goto LAB_001d6bc1;
      }
      if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
        (this->m_key_tag2).str = local_218.str;
        (this->m_key_tag2).len = local_218.len;
        this->m_key_tag2_indentation = sVar18;
        goto LAB_001d6bd1;
      }
      (this->m_key_tag).str = local_218.str;
      (this->m_key_tag).len = local_218.len;
    }
    else {
      if (((this->m_val_tag).len == 0) || ((this->m_val_tag).str == (char *)0x0)) {
        (this->m_val_tag).str = local_218.str;
        (this->m_val_tag).len = local_218.len;
        goto LAB_001d6bca;
      }
      (this->m_key_tag).str = local_218.str;
      (this->m_key_tag).len = local_218.len;
    }
  }
  this->m_key_tag_indentation = sVar18;
LAB_001d6bd1:
  if (((((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) &&
      (tag.len = uVar22, tag.str = (char *)local_218.len, YVar15 = to_tag((yml *)local_218.str,tag),
      YVar15 == TAG_STR)) && ((~this->m_state->flags & 0x1003U) == 0)) {
    cVar27 = _slurp_doc_scalar(this);
    Tree::to_val(this->m_tree,this->m_state->node_id,cVar27,0x10);
    this_00 = this->m_tree;
    sVar18 = this->m_state->node_id;
    cVar27 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(this_00,sVar18,cVar27);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
    pcVar17 = (this->m_val_anchor).str;
    if (pcVar17 != (char *)0x0 && (this->m_val_anchor).len != 0) {
      anchor.len = (this->m_val_anchor).len;
      anchor.str = pcVar17;
      Tree::set_val_anchor(this->m_tree,this->m_state->node_id,anchor);
      (this->m_val_anchor).str = (char *)0x0;
      (this->m_val_anchor).len = 0;
    }
    _end_stream(this);
  }
  return bVar12;
}

Assistant:

bool Parser::_handle_types()
{
    csubstr rem = m_state->line_contents.rem.triml(' ');
    csubstr t;

    if(rem.begins_with("!!"))
    {
        _c4dbgp("begins with '!!'");
        t = rem.left_of(rem.first_of(" ,"));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2);
        if(t == "!!set")
            add_flags(RSET);
    }
    else if(rem.begins_with("!<"))
    {
        _c4dbgp("begins with '!<'");
        t = rem.left_of(rem.first_of('>'), true);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2, t.len-1);
    }
    else if(rem.begins_with("!h!"))
    {
        _c4dbgp("begins with '!h!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 3);
        //t = t.sub(3);
    }
    else if(rem.begins_with('!'))
    {
        _c4dbgp("begins with '!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        //t = t.sub(1);
    }

    if(t.empty())
        return false;

    if(has_all(QMRK|SSCL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
        _c4dbgp("there is a stored key, so this tag is for the next element");
        _append_key_val_null(rem.str - 1);
        rem_flags(QMRK);
    }

    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    const char *tag_beginning = rem.str;
    #endif
    size_t tag_indentation = m_state->line_contents.current_col(t);
    _c4dbgpf("there was a tag: '{}', indentation={}", t, tag_indentation);
    _RYML_CB_ASSERT(m_stack.m_callbacks, t.end() > m_state->line_contents.rem.begin());
    _line_progressed(static_cast<size_t>(t.end() - m_state->line_contents.rem.begin()));
    {
        size_t pos = m_state->line_contents.rem.first_not_of(" \t");
        if(pos != csubstr::npos)
            _line_progressed(pos);
    }

    if(has_all(RMAP|RKEY))
    {
        _c4dbgpf("saving map key tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_key_tag.empty());
        m_key_tag = t;
        m_key_tag_indentation = tag_indentation;
    }
    else if(has_all(RMAP|RVAL))
    {
        /* foo: !!str
         * !!str : bar  */
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        _c4dbgpf("rem='{}'", rem);
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(rem == ':' || rem.begins_with(": "))
        {
            _c4dbgp("the last val was null, and this is a tag from a null key");
            _append_key_val_null(tag_beginning - 1);
            _store_scalar_null(rem.str - 1);
            // do not change the flag to key, it is ~
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begin() > m_state->line_contents.rem.begin());
            size_t token_len = rem == ':' ? 1 : 2;
            _line_progressed(static_cast<size_t>(token_len + rem.begin() - m_state->line_contents.rem.begin()));
        }
        #endif
        _c4dbgpf("saving map val tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
        m_val_tag = t;
        m_val_tag_indentation = tag_indentation;
    }
    else if(has_all(RSEQ|RVAL) || has_all(RTOP|RUNK|NDOC))
    {
        if(m_val_tag.empty())
        {
            _c4dbgpf("saving seq/doc val tag '{}'", t);
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving seq/doc key tag '{}'", t);
            m_key_tag = t;
            m_key_tag_indentation = tag_indentation;
        }
    }
    else if(has_all(RTOP|RUNK) || has_any(RUNK))
    {
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        if(rem.empty())
        {
            _c4dbgpf("saving val tag '{}'", t);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving key tag '{}'", t);
            if(m_key_tag.empty())
            {
                m_key_tag = t;
                m_key_tag_indentation = tag_indentation;
            }
            else
            {
                /* handle this case:
                 * !!str foo: !!map
                 *   !!int 1: !!float 20.0
                 *   !!int 3: !!float 40.0
                 *
                 * (m_key_tag would be !!str and m_key_tag2 would be !!int)
                 */
                m_key_tag2 = t;
                m_key_tag2_indentation = tag_indentation;
            }
        }
    }
    else
    {
        _c4err("internal error");
    }

    if(m_val_tag.not_empty())
    {
        YamlTag_e tag = to_tag(t);
        if(tag == TAG_STR)
        {
            _c4dbgpf("tag '{}' is a str-type tag", t);
            if(has_all(RTOP|RUNK|NDOC))
            {
                _c4dbgpf("docval. slurping the string. pos={}", m_state->pos.offset);
                csubstr scalar = _slurp_doc_scalar();
                _c4dbgpf("docval. after slurp: {}, at node {}: '{}'", m_state->pos.offset, m_state->node_id, scalar);
                m_tree->to_val(m_state->node_id, scalar, DOC);
                _c4dbgpf("docval. val tag {} -> {}", m_val_tag, normalize_tag(m_val_tag));
                m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
                m_val_tag.clear();
                if(!m_val_anchor.empty())
                {
                    _c4dbgpf("setting val anchor[{}]='{}'", m_state->node_id, m_val_anchor);
                    m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                    m_val_anchor.clear();
                }
                _end_stream();
            }
        }
    }
    return true;
}